

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManDumpDsd(If_DsdMan_t *p,int Support)

{
  int iVar1;
  FILE *__stream;
  Vec_Int_t *p_00;
  If_DsdObj_t *pObj_00;
  word *pTruth;
  int local_74;
  int local_40;
  int local_3c;
  int i;
  int v;
  FILE *pFile;
  Vec_Int_t *vMap;
  If_DsdObj_t *pObj;
  char *pFileName;
  int Support_local;
  If_DsdMan_t *p_local;
  
  __stream = fopen("tts_nondsd.txt","wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_nondsd.txt");
  }
  else {
    for (local_3c = 3; local_3c <= p->nVars; local_3c = local_3c + 1) {
      iVar1 = Vec_MemEntryNum(p->vTtMem[local_3c]);
      p_00 = Vec_IntStart(iVar1);
      for (local_40 = 0; iVar1 = Vec_PtrSize(&p->vObjs), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pObj_00 = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,local_40);
        if (((Support == 0) || (iVar1 = If_DsdObjSuppSize(pObj_00), Support == iVar1)) &&
           (iVar1 = If_DsdObjType(pObj_00), iVar1 == 6)) {
          iVar1 = If_DsdObjTruthId(p,pObj_00);
          iVar1 = Vec_IntEntry(p_00,iVar1);
          if (iVar1 == 0) {
            iVar1 = If_DsdObjTruthId(p,pObj_00);
            Vec_IntWriteEntry(p_00,iVar1,1);
            fprintf(__stream,"0x");
            pTruth = If_DsdObjTruth(p,pObj_00);
            if (Support == 0) {
              local_74 = local_3c;
            }
            else {
              local_74 = Abc_MaxInt(Support,6);
            }
            Abc_TtPrintHexRev((FILE *)__stream,pTruth,local_74);
            fprintf(__stream,"\n");
          }
        }
      }
      Vec_IntFree(p_00);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void If_DsdManDumpDsd( If_DsdMan_t * p, int Support )
{
    char * pFileName = "tts_nondsd.txt";
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    FILE * pFile = fopen( pFileName, "wb" );
    int v, i;
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        vMap = Vec_IntStart( Vec_MemEntryNum(p->vTtMem[v]) );
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
        {
            if ( Support && Support != If_DsdObjSuppSize(pObj) )
                continue;
            if ( If_DsdObjType(pObj) != IF_DSD_PRIME )
                continue;
            if ( Vec_IntEntry(vMap, If_DsdObjTruthId(p, pObj)) )
                continue;
            Vec_IntWriteEntry(vMap, If_DsdObjTruthId(p, pObj), 1);
            fprintf( pFile, "0x" );
            Abc_TtPrintHexRev( pFile, If_DsdObjTruth(p, pObj), Support ? Abc_MaxInt(Support, 6) : v );
            fprintf( pFile, "\n" );
            //printf( "    " );
            //Dau_DsdPrintFromTruth( If_DsdObjTruth(p, pObj), p->nVars );
        }
        Vec_IntFree( vMap );
    }
    fclose( pFile );
}